

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePicker::DateTimePicker(DateTimePicker *this,QDate *date,QWidget *parent)

{
  QDate QVar1;
  DateTimePickerPrivate *this_00;
  QSizePolicy type;
  QDate local_40;
  undefined8 uStack_38;
  undefined1 local_30 [16];
  Connection local_20 [8];
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001a96c8;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_001a9878;
  this_00 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(this_00,this,QDate);
  (this->d).d = this_00;
  type.field_0 = SUB84(this,0);
  QWidget::setSizePolicy(type);
  QVar1.jd = date->jd;
  if (0x16d3e147973 < date->jd + 0xb69eeff91fU) {
    QDate::QDate(&local_40,100,1,1);
    QVar1.jd = local_40.jd;
  }
  local_40.jd = QVar1.jd;
  setDate(this,&local_40);
  local_40.jd = (qint64)_q_scrollAboutToStart;
  uStack_38 = 0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_20,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::aboutToStart,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection(local_20);
  local_40.jd = (qint64)_q_scroll;
  uStack_38 = 0;
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::DateTimePicker::*)(int,int)>
            ((Object *)(local_30 + 8),(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::scroll,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)(local_30 + 8));
  local_40.jd = (qint64)_q_scrollFinished;
  uStack_38 = 0;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_30,(offset_in_Scroller_to_subr)((this->d).d)->scroller,
             (Object *)Scroller::finished,0,(ConnectionType)type.field_0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( const QDate & date, QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, QMetaType::QDate ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	setDate( date.isValid() ? date : DATETIMEPICKER_DATE_MIN );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}